

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.cc
# Opt level: O2

bool __thiscall
google::protobuf::MessageLite::MergeFromCodedStream(MessageLite *this,CodedInputStream *input)

{
  int iVar1;
  LogMessage *other;
  MessageLite *message;
  LogFinisher local_61;
  string local_60;
  LogMessage local_40;
  
  iVar1 = (*this->_vptr_MessageLite[8])();
  if ((char)iVar1 != '\0') {
    iVar1 = (*this->_vptr_MessageLite[5])(this);
    if ((char)iVar1 != '\0') {
      return true;
    }
    message = (MessageLite *)0x7b;
    internal::LogMessage::LogMessage
              (&local_40,LOGLEVEL_ERROR,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/message_lite.cc"
               ,0x7b);
    (anonymous_namespace)::InitializationErrorMessage_abi_cxx11_
              (&local_60,(_anonymous_namespace_ *)"parse",(char *)this,message);
    other = internal::LogMessage::operator<<(&local_40,&local_60);
    internal::LogFinisher::operator=(&local_61,other);
    std::__cxx11::string::~string((string *)&local_60);
    internal::LogMessage::~LogMessage(&local_40);
  }
  return false;
}

Assistant:

bool MessageLite::MergeFromCodedStream(io::CodedInputStream* input) {
  return InlineMergeFromCodedStream(input, this);
}